

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Line_SetBlocking(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  int iVar1;
  int line;
  FLineIdIterator itr;
  int i;
  int clearflags;
  int setflags;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if (arg0 == 0) {
    ln_local._4_4_ = 0;
  }
  else {
    i = 0;
    itr.start = 0;
    clearflags = arg2;
    setflags = arg1;
    for (itr.searchtag = 0; LS_Line_SetBlocking::flagtrans[itr.searchtag] != -1;
        itr.searchtag = itr.searchtag + 1) {
      if ((setflags & 1U) != 0) {
        i = LS_Line_SetBlocking::flagtrans[itr.searchtag] | i;
      }
      if ((clearflags & 1U) != 0) {
        itr.start = LS_Line_SetBlocking::flagtrans[itr.searchtag] | itr.start;
      }
      setflags = setflags >> 1;
      clearflags = clearflags >> 1;
    }
    FLineIdIterator::FLineIdIterator((FLineIdIterator *)&stack0xffffffffffffffbc,arg0);
    while( true ) {
      iVar1 = FLineIdIterator::Next((FLineIdIterator *)&stack0xffffffffffffffbc);
      if (iVar1 < 0) break;
      lines[iVar1].flags = lines[iVar1].flags & (itr.start ^ 0xffffffffU) | i;
    }
    ln_local._4_4_ = 1;
  }
  return ln_local._4_4_;
}

Assistant:

FUNC(LS_Line_SetBlocking)
// Line_SetBlocking (id, setflags, clearflags)
{
	static const int flagtrans[] =
	{
		ML_BLOCKING,
		ML_BLOCKMONSTERS,
		ML_BLOCK_PLAYERS,
		ML_BLOCK_FLOATERS,
		ML_BLOCKPROJECTILE,
		ML_BLOCKEVERYTHING,
		ML_RAILING,
		ML_BLOCKUSE,
		ML_BLOCKSIGHT,
		ML_BLOCKHITSCAN,
		ML_SOUNDBLOCK,
		-1
	};

	if (arg0 == 0) return false;

	int setflags = 0;
	int clearflags = 0;

	for(int i = 0; flagtrans[i] != -1; i++, arg1 >>= 1, arg2 >>= 1)
	{
		if (arg1 & 1) setflags |= flagtrans[i];
		if (arg2 & 1) clearflags |= flagtrans[i];
	}

	FLineIdIterator itr(arg0);
	int line;
	while ((line = itr.Next()) >= 0)
	{
		lines[line].flags = (lines[line].flags & ~clearflags) | setflags;
	}
	return true;
}